

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O0

Expected<llvm::DWARFDebugRnglist> * __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::findList
          (Expected<llvm::DWARFDebugRnglist> *__return_storage_ptr__,
          DWARFListTableBase<llvm::DWARFDebugRnglist> *this,DWARFDataExtractor Data,uint64_t Offset)

{
  DWARFDataExtractor DVar1;
  bool bVar2;
  pointer ppVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t End_00;
  mapped_type *this_00;
  size_t in_R9;
  StringRef SectionName;
  Error local_c0;
  StringRef local_b8;
  StringRef local_a8;
  char *local_98;
  size_t sStack_90;
  undefined8 local_88;
  DWARFObject *pDStack_80;
  DWARFSection *local_78;
  Error E;
  uint64_t StartingOffset;
  uint64_t End;
  DWARFDebugRnglist List;
  _Self local_28;
  iterator Entry;
  uint64_t Offset_local;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *this_local;
  
  DVar1 = Data;
  Entry._M_node = (_Base_ptr)Offset;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
       ::find(&this->ListMap,(key_type_conflict *)&Entry);
  List.super_DWARFListType<llvm::RangeListEntry>.Entries.
  super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                ::end(&this->ListMap);
  bVar2 = std::operator!=(&local_28,
                          (_Self *)&List.super_DWARFListType<llvm::RangeListEntry>.Entries.
                                    super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>::
             operator->(&local_28);
    Expected<llvm::DWARFDebugRnglist>::Expected<llvm::DWARFDebugRnglist&>
              (__return_storage_ptr__,&ppVar3->second,(type *)0x0);
  }
  else {
    DWARFDebugRnglist::DWARFDebugRnglist((DWARFDebugRnglist *)&End);
    uVar4 = getHeaderOffset(this);
    uVar5 = DWARFListTableHeader::length(&this->Header);
    E.Payload = (ErrorInfoBase *)Entry._M_node;
    local_78 = Data.Section;
    local_98 = Data.super_DataExtractor.Data.Data;
    sStack_90 = Data.super_DataExtractor.Data.Length;
    local_88._0_1_ = Data.super_DataExtractor.IsLittleEndian;
    local_88._1_1_ = Data.super_DataExtractor.AddressSize;
    local_88._2_6_ = Data.super_DataExtractor._18_6_;
    Data.Obj = DVar1.Obj;
    pDStack_80 = Data.Obj;
    End_00 = getHeaderOffset(this);
    local_a8 = DWARFListTableHeader::getSectionName(&this->Header);
    local_b8 = DWARFListTableHeader::getListTypeString(&this->Header);
    DVar1.super_DataExtractor.Data.Length = sStack_90;
    DVar1.super_DataExtractor.Data.Data = local_98;
    DVar1.super_DataExtractor.IsLittleEndian = (uint8_t)local_88;
    DVar1.super_DataExtractor.AddressSize = local_88._1_1_;
    DVar1.super_DataExtractor._18_6_ = local_88._2_6_;
    DVar1.Obj = pDStack_80;
    DVar1.Section = local_78;
    SectionName.Length = in_R9;
    SectionName.Data = (char *)&Entry;
    DWARFListType<llvm::RangeListEntry>::extract
              ((DWARFListType<llvm::RangeListEntry> *)&stack0xffffffffffffff90,DVar1,(uint64_t)&End,
               End_00,(uint64_t *)(uVar4 + uVar5),SectionName,local_a8);
    bVar2 = Error::operator_cast_to_bool((Error *)&stack0xffffffffffffff90);
    if (bVar2) {
      Error::Error(&local_c0,(Error *)&stack0xffffffffffffff90);
      Expected<llvm::DWARFDebugRnglist>::Expected(__return_storage_ptr__,&local_c0);
      Error::~Error(&local_c0);
    }
    Error::~Error((Error *)&stack0xffffffffffffff90);
    if (!bVar2) {
      this_00 = std::
                map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                ::operator[](&this->ListMap,(key_type_conflict *)&E);
      DWARFDebugRnglist::operator=(this_00,(DWARFDebugRnglist *)&End);
      Expected<llvm::DWARFDebugRnglist>::Expected<llvm::DWARFDebugRnglist>
                (__return_storage_ptr__,(DWARFDebugRnglist *)&End,(type *)0x0);
    }
    DWARFDebugRnglist::~DWARFDebugRnglist((DWARFDebugRnglist *)&End);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFListType>
DWARFListTableBase<DWARFListType>::findList(DWARFDataExtractor Data,
                                            uint64_t Offset) {
  auto Entry = ListMap.find(Offset);
  if (Entry != ListMap.end())
    return Entry->second;

  // Extract the list from the section and enter it into the list map.
  DWARFListType List;
  uint64_t End = getHeaderOffset() + Header.length();
  uint64_t StartingOffset = Offset;
  if (Error E =
          List.extract(Data, getHeaderOffset(), End, &Offset,
                       Header.getSectionName(), Header.getListTypeString()))
    return std::move(E);
  ListMap[StartingOffset] = List;
  return List;
}